

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution1D::forward(Deconvolution1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  int *piVar7;
  void *pvVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Mat *pMVar14;
  ulong uVar15;
  float *pfVar16;
  int iVar17;
  float *pfVar18;
  float *pfVar19;
  ulong uVar20;
  void *pvVar21;
  ulong uVar22;
  float *pfVar23;
  long lVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar29 [16];
  float fVar31;
  float fVar32;
  int iVar33;
  int iVar35;
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  Mat local_138;
  Mat *local_e8;
  Deconvolution1D *local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  float *local_c0;
  int local_b4;
  Option *local_b0;
  Mat *local_a8;
  ulong local_a0;
  long local_98;
  void *local_90;
  void *local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  float *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar17 = bottom_blob->w;
  sVar6 = bottom_blob->elemsize;
  iVar30 = this->kernel_w;
  iVar33 = this->output_pad_right;
  iVar35 = this->dilation_w;
  iVar2 = this->stride_w;
  local_138.cstep = 0;
  local_138.data = (float *)0x0;
  local_138.refcount._0_4_ = 0;
  local_138.refcount._4_4_ = 0;
  local_138.elemsize = 0;
  local_138.elempack = 0;
  local_138.allocator = (Allocator *)0x0;
  local_138.dims = 0;
  local_138.w = 0;
  local_138.h = 0;
  local_138.d = 0;
  local_138.c = 0;
  lVar24 = 0x10;
  if ((((this->pad_left < 1) && (this->pad_right < 1)) && (this->output_w < 1)) &&
     (lVar24 = 8, &local_138 != top_blob)) {
    piVar7 = top_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    local_138.data = top_blob->data;
    local_138.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_138.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_138.elemsize = top_blob->elemsize;
    local_138.elempack = top_blob->elempack;
    local_138.allocator = top_blob->allocator;
    uVar10 = top_blob->dims;
    uVar11 = top_blob->w;
    uVar12 = top_blob->h;
    uVar13 = top_blob->d;
    local_138.c = top_blob->c;
    local_138.cstep = top_blob->cstep;
    local_138.dims = uVar10;
    local_138.w = uVar11;
    local_138.h = uVar12;
    local_138.d = uVar13;
  }
  local_e8 = top_blob;
  local_b0 = opt;
  local_a8 = bottom_blob;
  Mat::create(&local_138,iVar33 + (iVar30 + -1) * iVar35 + (iVar17 + -1) * iVar2 + 1,
              this->num_output,sVar6,*(Allocator **)(&opt->lightmode + lVar24));
  iVar17 = -100;
  if (((float *)local_138.data != (float *)0x0) && ((long)local_138.c * local_138.cstep != 0)) {
    local_a0 = (ulong)(uint)local_138.h;
    local_90 = (this->bias_data).data;
    if (local_90 == (void *)0x0) {
      bVar26 = true;
    }
    else {
      bVar26 = (long)(this->bias_data).c * (this->bias_data).cstep == 0;
    }
    local_e0 = this;
    if (0 < local_138.h) {
      uVar3 = this->kernel_w;
      local_98 = (long)local_138.w;
      uVar4 = local_a8->w;
      uVar5 = local_a8->h;
      local_c8 = (ulong)(uint)local_138.w;
      iVar17 = this->dilation_w;
      local_88 = (this->weight_data).data;
      local_78 = (ulong)(local_138.w + 3U & 0xfffffffc);
      lVar24 = local_c8 - 1;
      auVar34._8_4_ = (int)lVar24;
      auVar34._0_8_ = lVar24;
      auVar34._12_4_ = (int)((ulong)lVar24 >> 0x20);
      local_80 = local_98 * local_138.elemsize;
      pfVar19 = (float *)((long)local_138.data + 0xc);
      local_60 = (long)this->stride_w << 2;
      local_b4 = uVar3 * uVar5;
      auVar34 = auVar34 ^ _DAT_00592200;
      local_d0 = (ulong)(this->activation_type - 1);
      local_d8 = 0;
      uVar20 = 0;
      pfVar16 = (float *)local_138.data;
      auVar36 = _DAT_00592300;
      auVar37 = _DAT_00592310;
      auVar38 = _DAT_00592200;
      local_58 = auVar34;
      do {
        fVar27 = 0.0;
        if (!bVar26) {
          fVar27 = *(float *)((long)local_90 + uVar20 * 4);
        }
        if (0 < (int)local_98) {
          uVar15 = 0;
          do {
            auVar28._8_4_ = (int)uVar15;
            auVar28._0_8_ = uVar15;
            auVar28._12_4_ = (int)(uVar15 >> 0x20);
            auVar29 = (auVar28 | auVar37) ^ auVar38;
            iVar33 = auVar34._0_4_;
            bVar9 = iVar33 < auVar29._0_4_;
            iVar30 = auVar29._4_4_;
            iVar35 = auVar34._4_4_;
            if ((bool)(~(iVar35 < iVar30 || iVar30 == iVar35 && bVar9) & 1)) {
              pfVar19[uVar15 - 3] = fVar27;
            }
            if (iVar35 >= iVar30 && (iVar30 != iVar35 || !bVar9)) {
              pfVar19[uVar15 - 2] = fVar27;
            }
            auVar28 = (auVar28 | auVar36) ^ auVar38;
            iVar30 = auVar28._4_4_;
            if (iVar30 <= iVar35 && (iVar30 != iVar35 || auVar28._0_4_ <= iVar33)) {
              pfVar19[uVar15 - 1] = fVar27;
              pfVar19[uVar15] = fVar27;
            }
            uVar15 = uVar15 + 4;
          } while (local_78 != uVar15);
        }
        if (0 < (int)uVar4) {
          pvVar8 = local_a8->data;
          iVar30 = local_a8->w;
          sVar6 = local_a8->elemsize;
          uVar15 = 0;
          pfVar18 = pfVar16;
          do {
            if (0 < (int)uVar5) {
              uVar22 = 0;
              pvVar21 = (void *)((long)local_88 + (long)(int)local_d8 * 4);
              do {
                if (0 < (int)uVar3) {
                  fVar27 = *(float *)((long)pvVar8 + (long)iVar30 * sVar6 * uVar22 + uVar15 * 4);
                  uVar25 = 0;
                  pfVar23 = pfVar18;
                  do {
                    *pfVar23 = *(float *)((long)pvVar21 + uVar25 * 4) * fVar27 + *pfVar23;
                    uVar25 = uVar25 + 1;
                    pfVar23 = pfVar23 + iVar17;
                  } while (uVar3 != uVar25);
                }
                uVar22 = uVar22 + 1;
                pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar3 * 4);
              } while (uVar22 != uVar5);
            }
            uVar15 = uVar15 + 1;
            pfVar18 = (float *)((long)pfVar18 + local_60);
          } while (uVar15 != uVar4);
        }
        local_70 = uVar20;
        local_68 = pfVar19;
        if (0 < (int)local_98) {
          local_c0 = (float *)(local_e0->activation_params).data;
          uVar22 = 0;
          uVar20 = local_c8;
          uVar15 = local_d0;
          do {
            fVar27 = pfVar16[uVar22];
            fVar32 = fVar27;
            if ((uint)uVar15 < 6) {
              switch((long)&switchD_00559b53::switchdataD_005a390c +
                     (long)(int)(&switchD_00559b53::switchdataD_005a390c)[uVar15]) {
              case 0x559b55:
                if (fVar27 <= 0.0) {
                  fVar32 = 0.0;
                }
                break;
              case 0x559b65:
                local_48 = ZEXT416((uint)fVar27);
                fVar27 = expf(fVar27);
                fVar27 = logf(fVar27 + 1.0);
                fVar27 = tanhf(fVar27);
                uVar20 = local_c8;
                uVar15 = local_d0;
                auVar34 = local_58;
                auVar36 = _DAT_00592300;
                auVar37 = _DAT_00592310;
                auVar38 = _DAT_00592200;
                fVar32 = fVar27 * (float)local_48._0_4_;
                break;
              case 0x559bd7:
                if (fVar27 <= *local_c0) {
                  fVar27 = *local_c0;
                }
                fVar32 = local_c0[1];
                if (fVar27 <= local_c0[1]) {
                  fVar32 = fVar27;
                }
                break;
              case 0x559bf9:
                if (88.37626 <= fVar27) {
                  fVar27 = 88.37626;
                }
                fVar27 = expf((float)(-(uint)(fVar27 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar27 < -88.37626) & ((uint)fVar27 ^ auVar38._0_4_)))
                ;
                uVar20 = local_c8;
                uVar15 = local_d0;
                auVar34 = local_58;
                auVar36 = _DAT_00592300;
                auVar37 = _DAT_00592310;
                auVar38 = _DAT_00592200;
                fVar32 = 1.0 / (fVar27 + 1.0);
                break;
              case 0x559c80:
                fVar32 = (float)(~-(uint)(0.0 < fVar27) & (uint)*local_c0 |
                                -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27;
                break;
              case 0x559caf:
                fVar1 = *local_c0;
                fVar31 = (float)((uint)local_c0[1] ^ auVar38._0_4_) / fVar1;
                fVar32 = 0.0;
                if ((fVar31 <= fVar27) && (fVar32 = fVar27, fVar27 <= fVar31 + 1.0 / fVar1)) {
                  fVar32 = (fVar1 * fVar27 + local_c0[1]) * fVar27;
                }
              }
            }
            pfVar16[uVar22] = fVar32;
            uVar22 = uVar22 + 1;
          } while (uVar20 != uVar22);
        }
        uVar20 = local_70 + 1;
        pfVar19 = (float *)((long)local_68 + local_80);
        pfVar16 = (float *)((long)pfVar16 + local_80);
        local_d8 = (ulong)(uint)((int)local_d8 + local_b4);
      } while (uVar20 != local_a0);
    }
    pMVar14 = local_e8;
    cut_padding(local_e0,&local_138,local_e8,local_b0);
    iVar17 = -100;
    if ((pMVar14->data != (void *)0x0) && (iVar17 = -100, (long)pMVar14->c * pMVar14->cstep != 0)) {
      iVar17 = 0;
    }
  }
  piVar7 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_138.allocator == (Allocator *)0x0) {
        if ((float *)local_138.data != (float *)0x0) {
          free(local_138.data);
        }
      }
      else {
        (*(local_138.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int Deconvolution1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution1d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}